

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

Am_Wrapper * find_prev_child_proc(Am_Object *self)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  ushort uVar6;
  Am_Object item;
  Am_Value_List nodes;
  Am_Object aAStack_38 [8];
  Am_Value_List local_30 [16];
  
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)PARENT);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  if (iVar2 == iVar3) {
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_No_Object);
    return pAVar5;
  }
  uVar6 = (ushort)aAStack_38;
  Am_Object::Get_Object(uVar6,(ulong)self);
  pAVar4 = (Am_Value *)Am_Object::Get(uVar6,0x82);
  Am_Value_List::Am_Value_List(local_30,pAVar4);
  Am_Object::~Am_Object(aAStack_38);
  cVar1 = Am_Value_List::Valid();
  if (cVar1 != '\0') {
    Am_Value_List::Move_Nth((int)local_30);
    Am_Value_List::Next();
    while( true ) {
      cVar1 = Am_Value_List::Last();
      if (cVar1 != '\0') break;
      pAVar4 = (Am_Value *)Am_Value_List::Get();
      Am_Object::Am_Object(aAStack_38,pAVar4);
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)PARENT);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      if (iVar2 == iVar3) {
        pAVar4 = (Am_Value *)Am_Object::Get(uVar6,0x85);
        iVar2 = Am_Value::operator_cast_to_int(pAVar4);
        if (iVar2 != iVar3) {
          pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(aAStack_38);
          Am_Object::~Am_Object(aAStack_38);
          goto LAB_00103df4;
        }
      }
      Am_Value_List::Next();
      Am_Object::~Am_Object(aAStack_38);
    }
  }
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_No_Object);
LAB_00103df4:
  Am_Value_List::~Am_Value_List(local_30);
  return pAVar5;
}

Assistant:

Am_Define_Object_Formula(find_prev_child)
{
  int rank = self.Get(Am_RANK);
  int parent_rank = self.Get(PARENT);
  if (rank == parent_rank)
    return Am_No_Object;
  Am_Value_List nodes = self.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  if (nodes.Valid()) {
    nodes.Move_Nth(rank);
    nodes.Next();
    while (!nodes.Last()) {
      Am_Object item = nodes.Get();
      if ((int)item.Get(PARENT) == parent_rank &&
          (int)item.Get(Am_RANK) != parent_rank)
        return item;
      nodes.Next();
    }
  }
  return Am_No_Object;
}